

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

VectorNd * __thiscall
UnitBoundedPolynomial<5U,_3U>::derivative
          (VectorNd *__return_storage_ptr__,UnitBoundedPolynomial<5U,_3U> *this,double t)

{
  int k;
  long lVar1;
  int k_1;
  long lVar2;
  VectorNd *d;
  double dy;
  double dVar3;
  double tt;
  double dVar4;
  
  lVar1 = 0;
  do {
    dVar3 = 0.0;
    lVar2 = 1;
    dVar4 = 1.0;
    do {
      dVar3 = dVar3 + (double)(int)lVar2 * this->_dims[0].coeffs[lVar2] * dVar4;
      dVar4 = dVar4 * t;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[lVar1] = dVar3;
    lVar1 = lVar1 + 1;
    this = (UnitBoundedPolynomial<5U,_3U> *)(this->_dims + 1);
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

typename UnitBoundedPolynomial<Order, Dims>::VectorNd UnitBoundedPolynomial<Order, Dims>::derivative(double t) const
{
    VectorNd d;

    for (int k = 0; k < Dims; ++k)
    {
        d[k] = _dims[k].derivative(t);
    }

    return d;
}